

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureMemoryRegistry.cpp
# Opt level: O3

void __thiscall SecureMemoryRegistry::~SecureMemoryRegistry(SecureMemoryRegistry *this)

{
  MutexFactory *this_00;
  
  this->_vptr_SecureMemoryRegistry = (_func_int **)&PTR__SecureMemoryRegistry_0019d960;
  if ((this->registry)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    softHSMLog(3,"~SecureMemoryRegistry",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureMemoryRegistry.cpp"
               ,0x33,"SecureMemoryRegistry is not empty: leak!");
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->SecMemRegistryMutex);
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->registry)._M_t);
  return;
}

Assistant:

SecureMemoryRegistry::~SecureMemoryRegistry()
{
	if (!registry.empty())
	{
		ERROR_MSG("SecureMemoryRegistry is not empty: leak!");
	}
	MutexFactory::i()->recycleMutex(SecMemRegistryMutex);
}